

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O1

void QDateTimeEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Data *pDVar1;
  long *plVar2;
  Data DVar3;
  long lVar4;
  Data DVar5;
  QArrayData *pQVar6;
  QDateTime *dt;
  LayoutDirection LVar7;
  Section SVar8;
  QTimeZonePrivate *pQVar9;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined8 local_50;
  Data local_48;
  undefined8 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    puStack_40 = (undefined8 *)_a[1];
    iVar10 = 0;
    goto LAB_003f19f6;
  case 1:
    puStack_40 = &local_50;
    local_50 = CONCAT44(local_50._4_4_,*_a[1]);
    iVar10 = 1;
    goto LAB_003f19f6;
  case 2:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    iVar10 = 2;
LAB_003f19f6:
    local_48.d = (QTimeZonePrivate *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar10,&local_48.d);
    break;
  case 3:
    setDateTime((QDateTimeEdit *)_o,(QDateTime *)_a[1]);
    break;
  case 4:
    setDate((QDateTimeEdit *)_o,(QDate)*_a[1]);
    break;
  case 5:
    setTime((QDateTimeEdit *)_o,(QTime)*_a[1]);
    break;
  case 6:
    lVar4 = *(long *)(_o + 8);
    if (*(int *)(lVar4 + 0x4fc) != 0) {
      *(undefined4 *)(lVar4 + 0x4fc) = 0;
      *(undefined4 *)(lVar4 + 0x3cc) = 0;
      *(undefined4 *)(lVar4 + 0x3c4) = 1;
      QWidget::update(*(QWidget **)(lVar4 + 8));
    }
  }
  switch(_c) {
  case ReadProperty:
switchD_003f190f_caseD_1:
    if (0x10 < (uint)_id) goto LAB_003f1c83;
    break;
  case WriteProperty:
    goto switchD_003f190f_caseD_2;
  case ResetProperty:
    goto switchD_003f190f_caseD_3;
  default:
    goto switchD_003f190f_caseD_4;
  case IndexOfMethod:
    plVar2 = (long *)_a[1];
    if (((code *)*plVar2 == dateTimeChanged) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_003f190f_caseD_4;
    }
    if (((code *)*plVar2 == timeChanged) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_003f190f_caseD_4;
    }
    if (((code *)*plVar2 == dateChanged) && (plVar2[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_003f190f_caseD_4;
    }
    if (_c != ResetProperty) {
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_003f190f_caseD_4;
        goto switchD_003f190f_caseD_1;
      }
      goto switchD_003f190f_caseD_2;
    }
    goto switchD_003f190f_caseD_3;
  }
  pDVar1 = (Data *)*_a;
  switch(_id) {
  case 0:
    goto LAB_003f1c06;
  case 1:
    goto LAB_003f1c57;
  case 2:
    goto LAB_003f1c77;
  case 3:
    goto LAB_003f1c06;
  case 4:
LAB_003f1c06:
    ::QVariant::toDateTime();
    DVar3.d = *(QTimeZonePrivate **)&pDVar1->s;
    pDVar1->s = (ShortData)local_48;
    local_48.d = DVar3.d;
    QDateTime::~QDateTime((QDateTime *)&local_48.s);
    goto LAB_003f1c83;
  case 5:
    goto LAB_003f1c57;
  case 6:
LAB_003f1c57:
    pQVar9 = (QTimeZonePrivate *)::QVariant::toDate();
    pDVar1->d = pQVar9;
    goto LAB_003f1c83;
  case 7:
    goto LAB_003f1c77;
  case 8:
LAB_003f1c77:
    SVar8 = ::QVariant::toTime();
    break;
  case 9:
    SVar8 = currentSection((QDateTimeEdit *)_o);
    break;
  case 10:
    SVar8 = *(Section *)(*(long *)(_o + 8) + 0x470);
    break;
  case 0xb:
    lVar4 = *(long *)(_o + 8);
    LVar7 = QWidget::layoutDirection((QWidget *)_o);
    lVar11 = 0x438;
    if (LVar7 == RightToLeft) {
      lVar11 = 0x4c0;
    }
    pQVar9 = *(QTimeZonePrivate **)(lVar4 + lVar11);
    DVar3 = *(Data *)(lVar4 + 8 + lVar11);
    DVar5 = *(Data *)(lVar4 + 0x10 + lVar11);
    if (pQVar9 != (QTimeZonePrivate *)0x0) {
      LOCK();
      *(int *)pQVar9 = *(int *)pQVar9 + 1;
      UNLOCK();
    }
    pQVar6 = (QArrayData *)pDVar1->d;
    pDVar1->d = pQVar9;
    pDVar1[1] = DVar3;
    pDVar1[2] = DVar5;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
    goto LAB_003f1c83;
  case 0xc:
    *(undefined1 *)pDVar1 = *(undefined1 *)(*(long *)(_o + 8) + 0x4fa);
    goto LAB_003f1c83;
  case 0xd:
    SVar8 = *(Section *)(*(long *)(_o + 8) + 0x3e0);
    break;
  case 0xe:
    SVar8 = *(Section *)(*(long *)(_o + 8) + 0x418);
    break;
  case 0xf:
    SVar8 = *(int *)(*(long *)(_o + 8) + 0x508) - AmPmSection & (MSecSection|AmPmSection);
    break;
  case 0x10:
    QTimeZone::QTimeZone((QTimeZone *)&local_48.s,(QTimeZone *)(*(long *)(_o + 8) + 0x508));
    DVar3.d = *(QTimeZonePrivate **)&pDVar1->s;
    pDVar1->s = (ShortData)local_48;
    local_48.d = DVar3.d;
    QTimeZone::~QTimeZone((QTimeZone *)&local_48.s);
    goto LAB_003f1c83;
  }
  *(Section *)pDVar1 = SVar8;
LAB_003f1c83:
  if (_c != ResetProperty) {
    if (_c != WriteProperty) goto switchD_003f190f_caseD_4;
switchD_003f190f_caseD_2:
    if ((uint)_id < 0x11) {
      dt = (QDateTime *)*_a;
      switch(_id) {
      case 0:
        setDateTime((QDateTimeEdit *)_o,dt);
        break;
      case 1:
        setDate((QDateTimeEdit *)_o,(QDate)*(qint64 *)dt);
        break;
      case 2:
        setTime((QDateTimeEdit *)_o,(QTime)*(int *)dt);
        break;
      case 3:
        setMaximumDateTime((QDateTimeEdit *)_o,dt);
        break;
      case 4:
        setMinimumDateTime((QDateTimeEdit *)_o,dt);
        break;
      case 5:
        setMaximumDate((QDateTimeEdit *)_o,(QDate)*(qint64 *)dt);
        break;
      case 6:
        setMinimumDate((QDateTimeEdit *)_o,(QDate)*(qint64 *)dt);
        break;
      case 7:
        setMaximumTime((QDateTimeEdit *)_o,(QTime)*(int *)dt);
        break;
      case 8:
        setMinimumTime((QDateTimeEdit *)_o,(QTime)*(int *)dt);
        break;
      case 9:
        setCurrentSection((QDateTimeEdit *)_o,*(Section *)dt);
        break;
      case 0xb:
        setDisplayFormat((QDateTimeEdit *)_o,(QString *)dt);
        break;
      case 0xc:
        setCalendarPopup((QDateTimeEdit *)_o,(bool)*dt);
        break;
      case 0xd:
        setCurrentSectionIndex((QDateTimeEdit *)_o,*(int *)dt);
        break;
      case 0xf:
        setTimeSpec((QDateTimeEdit *)_o,*(TimeSpec *)dt);
        break;
      case 0x10:
        setTimeZone((QDateTimeEdit *)_o,(QTimeZone *)dt);
      }
    }
    if (_c != ResetProperty) goto switchD_003f190f_caseD_4;
  }
switchD_003f190f_caseD_3:
  switch(_id) {
  case 3:
    clearMaximumDateTime((QDateTimeEdit *)_o);
    break;
  case 4:
    clearMinimumDateTime((QDateTimeEdit *)_o);
    break;
  case 5:
    QDate::QDate((QDate *)&local_48.s,9999,0xc,0x1f);
    setMaximumDate((QDateTimeEdit *)_o,(QDate)local_48.s);
    break;
  case 6:
    QDate::QDate((QDate *)&local_48.s,0x6d8,9,0xe);
    setMinimumDate((QDateTimeEdit *)_o,(QDate)local_48.s);
    break;
  case 7:
    QTime::QTime((QTime *)&local_48.s,0x17,0x3b,0x3b,999);
    setMaximumTime((QDateTimeEdit *)_o,(QTime)local_48._0_4_);
    break;
  case 8:
    QTime::QTime((QTime *)&local_48.s,0,0,0,0);
    setMinimumTime((QDateTimeEdit *)_o,(QTime)local_48._0_4_);
  }
switchD_003f190f_caseD_4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDateTimeEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dateTimeChanged((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 1: _t->timeChanged((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 2: _t->dateChanged((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->setDateTime((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 4: _t->setDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setTime((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 6: _t->d_func()->_q_resetButton(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(const QDateTime & )>(_a, &QDateTimeEdit::dateTimeChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(QTime )>(_a, &QDateTimeEdit::timeChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(QDate )>(_a, &QDateTimeEdit::dateChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDateTime*>(_v) = _t->dateTime(); break;
        case 1: *reinterpret_cast<QDate*>(_v) = _t->date(); break;
        case 2: *reinterpret_cast<QTime*>(_v) = _t->time(); break;
        case 3: *reinterpret_cast<QDateTime*>(_v) = _t->maximumDateTime(); break;
        case 4: *reinterpret_cast<QDateTime*>(_v) = _t->minimumDateTime(); break;
        case 5: *reinterpret_cast<QDate*>(_v) = _t->maximumDate(); break;
        case 6: *reinterpret_cast<QDate*>(_v) = _t->minimumDate(); break;
        case 7: *reinterpret_cast<QTime*>(_v) = _t->maximumTime(); break;
        case 8: *reinterpret_cast<QTime*>(_v) = _t->minimumTime(); break;
        case 9: *reinterpret_cast<Section*>(_v) = _t->currentSection(); break;
        case 10: QtMocHelpers::assignFlags<Sections>(_v, _t->displayedSections()); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->displayFormat(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->calendarPopup(); break;
        case 13: *reinterpret_cast<int*>(_v) = _t->currentSectionIndex(); break;
        case 14: *reinterpret_cast<int*>(_v) = _t->sectionCount(); break;
        case 15: *reinterpret_cast<Qt::TimeSpec*>(_v) = _t->timeSpec(); break;
        case 16: *reinterpret_cast<QTimeZone*>(_v) = _t->timeZone(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 1: _t->setDate(*reinterpret_cast<QDate*>(_v)); break;
        case 2: _t->setTime(*reinterpret_cast<QTime*>(_v)); break;
        case 3: _t->setMaximumDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 4: _t->setMinimumDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 5: _t->setMaximumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 6: _t->setMinimumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 7: _t->setMaximumTime(*reinterpret_cast<QTime*>(_v)); break;
        case 8: _t->setMinimumTime(*reinterpret_cast<QTime*>(_v)); break;
        case 9: _t->setCurrentSection(*reinterpret_cast<Section*>(_v)); break;
        case 11: _t->setDisplayFormat(*reinterpret_cast<QString*>(_v)); break;
        case 12: _t->setCalendarPopup(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setCurrentSectionIndex(*reinterpret_cast<int*>(_v)); break;
        case 15: _t->setTimeSpec(*reinterpret_cast<Qt::TimeSpec*>(_v)); break;
        case 16: _t->setTimeZone(*reinterpret_cast<QTimeZone*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 3: _t->clearMaximumDateTime(); break;
        case 4: _t->clearMinimumDateTime(); break;
        case 5: _t->clearMaximumDate(); break;
        case 6: _t->clearMinimumDate(); break;
        case 7: _t->clearMaximumTime(); break;
        case 8: _t->clearMinimumTime(); break;
        default: break;
        }
    }
}